

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O3

void vector_print(FILE *fp,vector_t v,int32 dim)

{
  ulong uVar1;
  
  if (0 < dim) {
    uVar1 = 0;
    do {
      fprintf((FILE *)fp," %11.4e",(double)(float)v[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((uint)dim != uVar1);
  }
  fputc(10,(FILE *)fp);
  fflush((FILE *)fp);
  return;
}

Assistant:

void
vector_print(FILE * fp, vector_t v, int32 dim)
{
    int32 i;

    for (i = 0; i < dim; i++)
        fprintf(fp, " %11.4e", v[i]);
    fprintf(fp, "\n");
    fflush(fp);
}